

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.cpp
# Opt level: O0

FString GetStatString(void)

{
  uint uVar1;
  OneLevel *pOVar2;
  char *pcVar3;
  FString *in_RDI;
  OneLevel *l;
  uint local_20;
  uint i;
  FString *compose;
  
  FString::FString(in_RDI);
  for (local_20 = 0; uVar1 = TArray<OneLevel,_OneLevel>::Size(&LevelData), local_20 < uVar1;
      local_20 = local_20 + 1) {
    pOVar2 = TArray<OneLevel,_OneLevel>::operator[](&LevelData,(ulong)local_20);
    pcVar3 = FString::GetChars(&pOVar2->Levelname);
    FString::AppendFormat
              (in_RDI,"Level %s - Kills: %d/%d - Secrets: %d/%d - Time: %d:%02d\n",pcVar3,
               (ulong)(uint)pOVar2->killcount,(ulong)(uint)pOVar2->totalkills,
               (ulong)(uint)pOVar2->secretcount,pOVar2->totalsecrets,pOVar2->leveltime / 0x834,
               (pOVar2->leveltime / 0x23) % 0x3c);
  }
  return (FString)(char *)in_RDI;
}

Assistant:

FString GetStatString()
{
	FString compose;
	for(unsigned i = 0; i < LevelData.Size(); i++)
	{
		OneLevel *l = &LevelData[i];
		compose.AppendFormat("Level %s - Kills: %d/%d - Secrets: %d/%d - Time: %d:%02d\n", 
			l->Levelname.GetChars(), l->killcount, l->totalkills, l->secretcount, l->totalsecrets,
			l->leveltime/(60*TICRATE), (l->leveltime/TICRATE)%60);
	}
	return compose;
}